

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O1

void __thiscall xray_re::xr_mesh_builder::remove_empty_surfmaps(xr_mesh_builder *this)

{
  pointer ppxVar1;
  xr_surfmap *pxVar2;
  pointer puVar3;
  pointer ppxVar4;
  pointer ppxVar5;
  
  ppxVar1 = (this->super_xr_mesh).m_surfmaps.
            super__Vector_base<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppxVar4 = (this->super_xr_mesh).m_surfmaps.
            super__Vector_base<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppxVar5 = ppxVar4;
  for (; ppxVar4 != ppxVar1; ppxVar4 = ppxVar4 + 1) {
    pxVar2 = *ppxVar4;
    puVar3 = (pxVar2->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (puVar3 == (pxVar2->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      if (pxVar2 != (xr_surfmap *)0x0) {
        if (puVar3 != (pointer)0x0) {
          operator_delete(puVar3,(long)(pxVar2->faces).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)puVar3);
        }
        operator_delete(pxVar2,0x20);
      }
    }
    else {
      if (ppxVar4 != ppxVar5) {
        *ppxVar5 = pxVar2;
      }
      ppxVar5 = ppxVar5 + 1;
    }
  }
  ppxVar4 = (this->super_xr_mesh).m_surfmaps.
            super__Vector_base<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((ppxVar5 != ppxVar4) &&
     (ppxVar1 = (this->super_xr_mesh).m_surfmaps.
                super__Vector_base<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>.
                _M_impl.super__Vector_impl_data._M_finish,
     ppxVar5 = (pointer)((long)ppxVar5 + ((long)ppxVar1 - (long)ppxVar4)), ppxVar1 != ppxVar5)) {
    (this->super_xr_mesh).m_surfmaps.
    super__Vector_base<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppxVar5;
  }
  return;
}

Assistant:

void xr_mesh_builder::remove_empty_surfmaps()
{
	xr_surfmap_vec_it last = m_surfmaps.begin();
	for (xr_surfmap_vec_it it = last, end = m_surfmaps.end(); it != end; ++it) {
		xr_surfmap* smap = *it;
		if (smap->faces.empty()) {
			delete smap;
			continue;
		}
		if (it != last)
			*last = smap;
		++last;
	}
	m_surfmaps.erase(last, m_surfmaps.end());
}